

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_mem_legacy.c
# Opt level: O2

RK_S32 commit_memory_handle(vpu_display_mem_pool *p,RK_S32 mem_hdl,RK_S32 size)

{
  undefined8 local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  RK_S32 local_28;
  uint local_24;
  
  if (((byte)vpu_mem_debug & 1) != 0) {
    _mpp_log_l(4,0,"in  pool %p hnl %p size %d\n","commit_memory_handle",p,mem_hdl,size);
  }
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 1;
  uStack_40 = (ulong)(size & 0x7ffffff);
  local_24 = (uint)size >> 0x1b;
  *(RK_S32 *)&p[1].get_free = size;
  p->buff_size = size;
  local_28 = mem_hdl;
  mpp_buffer_import_with_tag(p[1].commit_hdl,&local_48,0,0,"commit_memory_handle");
  if (((byte)vpu_mem_debug & 1) != 0) {
    _mpp_log_l(4,0,"out pool %p fd %d\n","commit_memory_handle",p,local_28);
  }
  return local_28;
}

Assistant:

static RK_S32
commit_memory_handle(vpu_display_mem_pool *p, RK_S32 mem_hdl, RK_S32 size)
{
    MppBufferInfo info;
    vpu_display_mem_pool_impl *p_mempool = (vpu_display_mem_pool_impl *)p;

    vpu_mem_dbg_func("in  pool %p hnl %p size %d\n", p, mem_hdl, size);
    memset(&info, 0, sizeof(MppBufferInfo));
    info.type = MPP_BUFFER_TYPE_ION;
    info.fd = mem_hdl;
    info.size = size & 0x07ffffff;
    info.index = (size & 0xf8000000) >> 27;

    p_mempool->size = size;
    p_mempool->buff_size = size;

    mpp_buffer_commit(p_mempool->group, &info);
    vpu_mem_dbg_func("out pool %p fd %d\n", p, info.fd);
    return info.fd;
}